

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::JXS::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  ILogSink *this_00;
  
  if (*(int *)(Ctx + 0x18) == 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"The frame buffer size is zero.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if (*(int *)(FrameBuf + 0x370) == 2) {
      ASDCP::MXF::h__WriterState::Goto_RUNNING((h__WriterState *)&stack0xffffffffffffff70);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
    }
    if (-1 < *(int *)&(this->super_h__AS02WriterFrame).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      h__AS02WriterFrame::WriteEKLVPacket
                ((h__AS02WriterFrame *)&stack0xffffffffffffff70,(FrameBuffer *)FrameBuf,
                 (byte_t *)Ctx,(ui32_t *)(FrameBuf + 0x5b0),(AESEncContext *)&ASDCP::MXF_BER_LENGTH,
                 HMAC);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff70);
      Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff70);
      *(int *)(FrameBuf + 0x338) = *(int *)(FrameBuf + 0x338) + 1;
    }
  }
  return this;
}

Assistant:

Result_t
AS_02::JXS::MXFWriter::h__Writer::WriteFrame(const ASDCP::JXS::FrameBuffer& FrameBuf,
					      AESEncContext* Ctx, HMACContext* HMAC)
{
  if ( FrameBuf.Size() == 0 )
    {
      DefaultLogSink().Error("The frame buffer size is zero.\n");
      return RESULT_PARAM;
    }

  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    {
      result = m_State.Goto_RUNNING(); // first time through
    }

  if ( KM_SUCCESS(result) )
    {
      result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);
      m_FramesWritten++;
    }

  return result;
}